

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btGjkPairDetector.cpp
# Opt level: O0

void __thiscall
btGjkPairDetector::btGjkPairDetector
          (btGjkPairDetector *this,btConvexShape *objectA,btConvexShape *objectB,
          btVoronoiSimplexSolver *simplexSolver,
          btConvexPenetrationDepthSolver *penetrationDepthSolver)

{
  int iVar1;
  _func_int **in_RCX;
  btCollisionShape *in_RDX;
  btCollisionShape *in_RSI;
  btDiscreteCollisionDetectorInterface *in_RDI;
  _func_int **in_R8;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Da_00;
  btScalar local_34;
  btScalar local_30;
  btScalar local_2c;
  _func_int **local_28;
  _func_int **local_20;
  btCollisionShape *local_18;
  btCollisionShape *local_10;
  
  local_28 = in_R8;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  btDiscreteCollisionDetectorInterface::btDiscreteCollisionDetectorInterface(in_RDI);
  in_RDI->_vptr_btDiscreteCollisionDetectorInterface =
       (_func_int **)&PTR__btGjkPairDetector_002e6af0;
  local_2c = 0.0;
  local_30 = 1.0;
  local_34 = 0.0;
  btVector3::btVector3((btVector3 *)(in_RDI + 1),&local_2c,&local_30,&local_34);
  in_RDI[3]._vptr_btDiscreteCollisionDetectorInterface = local_28;
  in_RDI[4]._vptr_btDiscreteCollisionDetectorInterface = local_20;
  in_RDI[5]._vptr_btDiscreteCollisionDetectorInterface = (_func_int **)local_10;
  in_RDI[6]._vptr_btDiscreteCollisionDetectorInterface = (_func_int **)local_18;
  iVar1 = btCollisionShape::getShapeType(local_10);
  *(int *)&in_RDI[7]._vptr_btDiscreteCollisionDetectorInterface = iVar1;
  iVar1 = btCollisionShape::getShapeType(local_18);
  *(int *)((long)&in_RDI[7]._vptr_btDiscreteCollisionDetectorInterface + 4) = iVar1;
  (*local_10->_vptr_btCollisionShape[0xc])();
  *(undefined4 *)&in_RDI[8]._vptr_btDiscreteCollisionDetectorInterface = extraout_XMM0_Da;
  (*local_18->_vptr_btCollisionShape[0xc])();
  *(undefined4 *)((long)&in_RDI[8]._vptr_btDiscreteCollisionDetectorInterface + 4) =
       extraout_XMM0_Da_00;
  *(undefined1 *)&in_RDI[9]._vptr_btDiscreteCollisionDetectorInterface = 0;
  *(undefined4 *)&in_RDI[10]._vptr_btDiscreteCollisionDetectorInterface = 0xffffffff;
  *(undefined4 *)((long)&in_RDI[0xb]._vptr_btDiscreteCollisionDetectorInterface + 4) = 1;
  *(undefined4 *)&in_RDI[0xc]._vptr_btDiscreteCollisionDetectorInterface = 1;
  return;
}

Assistant:

btGjkPairDetector::btGjkPairDetector(const btConvexShape* objectA,const btConvexShape* objectB,btSimplexSolverInterface* simplexSolver,btConvexPenetrationDepthSolver*	penetrationDepthSolver)
:m_cachedSeparatingAxis(btScalar(0.),btScalar(1.),btScalar(0.)),
m_penetrationDepthSolver(penetrationDepthSolver),
m_simplexSolver(simplexSolver),
m_minkowskiA(objectA),
m_minkowskiB(objectB),
m_shapeTypeA(objectA->getShapeType()),
m_shapeTypeB(objectB->getShapeType()),
m_marginA(objectA->getMargin()),
m_marginB(objectB->getMargin()),
m_ignoreMargin(false),
m_lastUsedMethod(-1),
m_catchDegeneracies(1),
m_fixContactNormalDirection(1)
{
}